

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethread.c
# Opt level: O0

int fp_enc_row_mt_worker_hook(void *arg1,void *unused)

{
  long lVar1;
  pthread_mutex_t *__mutex;
  byte bVar2;
  int iVar3;
  AV1_COMP *cpi_00;
  long lVar4;
  int *in_RSI;
  long *in_RDI;
  AV1_COMMON *unaff_retaddr;
  int unit_height_log2;
  ThreadData_conflict *td;
  AV1EncRowMultiThreadSync *row_mt_sync;
  TileDataEnc *this_tile;
  _Bool firstpass_mt_exit;
  int current_mi_row;
  int end_of_frame;
  int unit_height;
  BLOCK_SIZE fp_block_size;
  int cur_tile_id;
  AV1_COMMON *cm;
  MACROBLOCKD *xd;
  aom_internal_error_info *error_info;
  pthread_mutex_t *enc_row_mt_mutex_;
  AV1EncRowMultiThreadInfo *enc_row_mt;
  int thread_id;
  AV1_COMP *cpi;
  EncWorkerData *thread_data;
  BLOCK_SIZE in_stack_000000cb;
  int in_stack_000000cc;
  TileDataEnc *in_stack_000000d0;
  ThreadData_conflict *in_stack_000000d8;
  AV1_COMP *in_stack_000000e0;
  int local_6c;
  int local_68;
  uint local_64;
  byte local_5d;
  int local_5c;
  long local_58;
  long lVar5;
  long *end_of_frame_00;
  long *cur_tile_id_00;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  int iVar6;
  
  lVar1 = *in_RDI;
  iVar6 = *(int *)((long)in_RDI + 0x1cc);
  __mutex = *(pthread_mutex_t **)(lVar1 + 0x9afb8);
  cpi_00 = (AV1_COMP *)(in_RDI[1] + 0x1a0);
  *(long **)(in_RDI[1] + 0x2b90) = in_RDI + 3;
  lVar5 = lVar1;
  end_of_frame_00 = in_RDI;
  cur_tile_id_00 = in_RDI;
  iVar3 = _setjmp((__jmp_buf_tag *)(in_RDI + 0x1e));
  if (iVar3 == 0) {
    *(undefined4 *)(in_RDI + 0x1d) = 1;
    local_58 = lVar5 + 0x3bf80;
    local_5c = *(int *)(lVar1 + 0x9aea8 + (long)iVar6 * 4);
    local_5d = *(byte *)(lVar5 + 0x9d514);
    local_64 = (uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                     [local_5d];
    local_68 = 0;
    while( true ) {
      local_6c = -1;
      pthread_mutex_lock(__mutex);
      bVar2 = *(byte *)(lVar1 + 0x9afb5) & 1;
      if (bVar2 == 0) {
        iVar6 = get_next_job((TileDataEnc *)(*(long *)(lVar5 + 0x71318) + (long)local_5c * 0x5d10),
                             &local_6c,local_64);
        if (iVar6 == 0) {
          switch_tile_and_get_next_job
                    (unaff_retaddr,
                     (TileDataEnc *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                     (int *)cur_tile_id_00,in_RSI,(int *)end_of_frame_00,(int)((ulong)lVar5 >> 0x20)
                     ,(BLOCK_SIZE)td);
        }
      }
      pthread_mutex_unlock(__mutex);
      if ((bVar2 != 0) || (local_68 != 0)) break;
      lVar4 = *(long *)(lVar5 + 0x71318) + (long)local_5c * 0x5d10;
      av1_first_pass_row(in_stack_000000e0,in_stack_000000d8,in_stack_000000d0,in_stack_000000cc,
                         in_stack_000000cb);
      pthread_mutex_lock(__mutex);
      *(int *)(lVar4 + 0x5d00) = *(int *)(lVar4 + 0x5d00) + -1;
      pthread_mutex_unlock(__mutex);
    }
    *(undefined4 *)(in_RDI + 0x1d) = 0;
    iVar6 = 1;
  }
  else {
    *(undefined4 *)(in_RDI + 0x1d) = 0;
    pthread_mutex_lock(__mutex);
    *(undefined1 *)(lVar1 + 0x9afb5) = 1;
    pthread_mutex_unlock(__mutex);
    set_firstpass_encode_done(cpi_00);
    iVar6 = 0;
  }
  return iVar6;
}

Assistant:

static int fp_enc_row_mt_worker_hook(void *arg1, void *unused) {
  EncWorkerData *const thread_data = (EncWorkerData *)arg1;
  AV1_COMP *const cpi = thread_data->cpi;
  int thread_id = thread_data->thread_id;
  AV1EncRowMultiThreadInfo *const enc_row_mt = &cpi->mt_info.enc_row_mt;
#if CONFIG_MULTITHREAD
  pthread_mutex_t *enc_row_mt_mutex_ = enc_row_mt->mutex_;
#endif
  (void)unused;
  struct aom_internal_error_info *const error_info = &thread_data->error_info;
  MACROBLOCKD *const xd = &thread_data->td->mb.e_mbd;
  xd->error_info = error_info;

  // The jmp_buf is valid only for the duration of the function that calls
  // setjmp(). Therefore, this function must reset the 'setjmp' field to 0
  // before it returns.
  if (setjmp(error_info->jmp)) {
    error_info->setjmp = 0;
#if CONFIG_MULTITHREAD
    pthread_mutex_lock(enc_row_mt_mutex_);
    enc_row_mt->firstpass_mt_exit = true;
    pthread_mutex_unlock(enc_row_mt_mutex_);
#endif
    set_firstpass_encode_done(cpi);
    return 0;
  }
  error_info->setjmp = 1;

  AV1_COMMON *const cm = &cpi->common;
  int cur_tile_id = enc_row_mt->thread_id_to_tile_id[thread_id];
  assert(cur_tile_id != -1);

  const BLOCK_SIZE fp_block_size = cpi->fp_block_size;
  const int unit_height = mi_size_high[fp_block_size];
  int end_of_frame = 0;
  while (1) {
    int current_mi_row = -1;
#if CONFIG_MULTITHREAD
    pthread_mutex_lock(enc_row_mt_mutex_);
#endif
    bool firstpass_mt_exit = enc_row_mt->firstpass_mt_exit;
    if (!firstpass_mt_exit && !get_next_job(&cpi->tile_data[cur_tile_id],
                                            &current_mi_row, unit_height)) {
      // No jobs are available for the current tile. Query for the status of
      // other tiles and get the next job if available
      switch_tile_and_get_next_job(cm, cpi->tile_data, &cur_tile_id,
                                   &current_mi_row, &end_of_frame, 1,
                                   fp_block_size);
    }
#if CONFIG_MULTITHREAD
    pthread_mutex_unlock(enc_row_mt_mutex_);
#endif
    // When firstpass_mt_exit is set to true, other workers need not pursue any
    // further jobs.
    if (firstpass_mt_exit || end_of_frame) break;

    TileDataEnc *const this_tile = &cpi->tile_data[cur_tile_id];
    AV1EncRowMultiThreadSync *const row_mt_sync = &this_tile->row_mt_sync;
    ThreadData *td = thread_data->td;

    assert(current_mi_row != -1 &&
           current_mi_row < this_tile->tile_info.mi_row_end);

    const int unit_height_log2 = mi_size_high_log2[fp_block_size];
    av1_first_pass_row(cpi, td, this_tile, current_mi_row >> unit_height_log2,
                       fp_block_size);
#if CONFIG_MULTITHREAD
    pthread_mutex_lock(enc_row_mt_mutex_);
#endif
    row_mt_sync->num_threads_working--;
#if CONFIG_MULTITHREAD
    pthread_mutex_unlock(enc_row_mt_mutex_);
#endif
  }
  error_info->setjmp = 0;
  return 1;
}